

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

uint P_GetSkyboxPortal(ASkyViewpoint *actor)

{
  sector_t *psVar1;
  bool bVar2;
  uint uVar3;
  FSectorPortal *pFVar4;
  MetaClass *this;
  uint local_1c;
  uint i;
  uint i_1;
  ASkyViewpoint *actor_local;
  
  if (actor == (ASkyViewpoint *)0x0) {
    actor_local._4_4_ = 1;
  }
  else {
    for (local_1c = 0; uVar3 = TArray<FSectorPortal,_FSectorPortal>::Size(&sectorPortals),
        local_1c < uVar3; local_1c = local_1c + 1) {
      pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)local_1c);
      bVar2 = TObjPtr<AActor>::operator==(&pFVar4->mSkybox,&actor->super_AActor);
      if (bVar2) {
        return local_1c;
      }
    }
    actor_local._4_4_ = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
    pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[]
                       (&sectorPortals,(ulong)actor_local._4_4_);
    memset(pFVar4,0,0x40);
    pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[]
                       (&sectorPortals,(ulong)actor_local._4_4_);
    pFVar4->mType = 0;
    this = AActor::GetClass(&actor->super_AActor);
    bVar2 = PClass::IsDescendantOf(&this->super_PClass,ASkyCamCompat::RegistrationInfo.MyClass);
    pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[]
                       (&sectorPortals,(ulong)actor_local._4_4_);
    pFVar4->mFlags = (uint)!bVar2;
    pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[]
                       (&sectorPortals,(ulong)actor_local._4_4_);
    TObjPtr<AActor>::operator=(&pFVar4->mSkybox,&actor->super_AActor);
    psVar1 = (actor->super_AActor).Sector;
    pFVar4 = TArray<FSectorPortal,_FSectorPortal>::operator[]
                       (&sectorPortals,(ulong)actor_local._4_4_);
    pFVar4->mDestination = psVar1;
  }
  return actor_local._4_4_;
}

Assistant:

unsigned P_GetSkyboxPortal(ASkyViewpoint *actor)
{
	if (actor == NULL) return 1;	// this means a regular sky.
	for (unsigned i = 0;i<sectorPortals.Size();i++)
	{
		if (sectorPortals[i].mSkybox == actor) return i;
	}
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[i].mFlags = actor->GetClass()->IsDescendantOf(RUNTIME_CLASS(ASkyCamCompat)) ? 0 : PORTSF_SKYFLATONLY;
	sectorPortals[i].mSkybox = actor;
	sectorPortals[i].mDestination = actor->Sector;
	return i;
}